

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *
__thiscall
fmt::v7::detail::
make_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
          (basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *__return_storage_ptr__,detail *this,basic_string_view<char> *value)

{
  size_t sVar1;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *arg;
  arg_mapper<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_49;
  basic_string_view<char> local_48;
  basic_string_view<char> local_38;
  basic_string_view<char> *local_28;
  basic_string_view<char> *value_local;
  basic_string_view<char> local_18;
  
  local_28 = (basic_string_view<char> *)this;
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_arg(__return_storage_ptr__);
  __return_storage_ptr__->type_ = string_type;
  local_48 = arg_mapper<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             ::map<fmt::v7::basic_string_view<char>,_0>(&local_49,local_28);
  local_18.data_ = local_48.data_;
  local_18.size_ = local_48.size_;
  value_local = &local_38;
  local_38.data_ = basic_string_view<char>::data(&local_18);
  sVar1 = basic_string_view<char>::size(&local_18);
  (__return_storage_ptr__->value_).field_0.string.data = local_38.data_;
  (__return_storage_ptr__->value_).field_0.string.size = sVar1;
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR basic_format_arg<Context> make_arg(const T& value) {
  basic_format_arg<Context> arg;
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = arg_mapper<Context>().map(value);
  return arg;
}